

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepTiledExamples.cpp
# Opt level: O1

void readDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ
                      ,Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint *puVar7;
  float **ppfVar8;
  half **pphVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long local_140;
  long local_110;
  DeepTiledInputFile file;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Base_ptr local_e8;
  Slice local_d0 [56];
  DeepFrameBuffer frameBuffer;
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile(&file,filename,iVar1);
  iVar1 = (dataWindow->max).x - (dataWindow->min).x;
  iVar2 = (dataWindow->max).y - (dataWindow->min).y;
  uVar3 = iVar2 + 1;
  lVar11 = (long)(int)uVar3;
  lVar6 = (long)(int)((long)iVar1 + 1);
  uVar15 = lVar11 * lVar6;
  puVar7 = (uint *)operator_new__(-(ulong)(uVar15 >> 0x3e != 0) | uVar15 * 4);
  if (sampleCount->_data != (uint *)0x0) {
    operator_delete__(sampleCount->_data);
  }
  sampleCount->_sizeX = lVar11;
  sampleCount->_sizeY = lVar6;
  sampleCount->_data = puVar7;
  uVar15 = -(ulong)(uVar15 >> 0x3d != 0) | uVar15 * 8;
  ppfVar8 = (float **)operator_new__(uVar15);
  if (dataZ->_data != (float **)0x0) {
    operator_delete__(dataZ->_data);
  }
  dataZ->_sizeX = lVar11;
  dataZ->_sizeY = lVar6;
  dataZ->_data = ppfVar8;
  pphVar9 = (half **)operator_new__(uVar15);
  if (dataA->_data != (half **)0x0) {
    operator_delete__(dataA->_data);
  }
  dataA->_sizeX = lVar11;
  dataA->_sizeY = lVar6;
  dataA->_data = pphVar9;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_4::Slice::Slice
            (local_d0,UINT,
             (char *)(sampleCount->_data +
                     (-(long)(dataWindow->min).x - (long)(dataWindow->min).y * ((long)iVar1 + 1))),4
             ,lVar6 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,FLOAT,
             (char *)(dataZ->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar6)),8,
             lVar6 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x11471a);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,HALF,
             (char *)(dataA->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar6)),8,
             lVar6 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x114720);
  Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar4 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
  iVar5 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
  Imf_3_4::DeepTiledInputFile::readPixelSampleCounts((int)&file,0,iVar4 + -1,0,iVar5 + -1);
  if (-1 < iVar2) {
    lVar6 = sampleCount->_sizeY;
    local_140 = 0;
    local_110 = 0;
    uVar15 = 0;
    do {
      if (-1 < iVar1) {
        lVar13 = dataA->_sizeY * local_110;
        lVar14 = dataZ->_sizeY * local_110;
        uVar12 = (ulong)(iVar1 + 1);
        lVar11 = local_140;
        do {
          pvVar10 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar11) << 2);
          *(void **)((long)dataZ->_data + lVar14) = pvVar10;
          pvVar10 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar11) * 2);
          *(void **)((long)dataA->_data + lVar13) = pvVar10;
          lVar13 = lVar13 + 8;
          lVar11 = lVar11 + 4;
          lVar14 = lVar14 + 8;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      uVar15 = uVar15 + 1;
      local_110 = local_110 + 8;
      local_140 = local_140 + lVar6 * 4;
    } while (uVar15 != uVar3);
  }
  Imf_3_4::DeepTiledInputFile::readTiles((int)&file,0,iVar4 + -1,0,iVar5 + -1);
  if (-1 < iVar2) {
    lVar6 = 0;
    uVar15 = 0;
    do {
      if (-1 < iVar1) {
        uVar12 = 0;
        do {
          pvVar10 = *(void **)((long)dataZ->_data + uVar12 * 8 + dataZ->_sizeY * lVar6);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)dataA->_data + uVar12 * 8 + dataA->_sizeY * lVar6);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          uVar12 = uVar12 + 1;
        } while (iVar1 + 1 != uVar12);
      }
      uVar15 = uVar15 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar15 != uVar3);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  if (local_e8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  return;
}

Assistant:

void
readDeepTiledFile (
    const char             filename[],
    Box2i&                 displayWindow,
    Box2i&                 dataWindow,
    Array2D<float*>&       dataZ,
    Array2D<half*>&        dataA,
    Array2D<unsigned int>& sampleCount)
{
    //
    // Read a deep image using class DeepTiledInputFile.  Try to read one
    // channel, A, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the A, and Z pixels in two
    // separate memory buffers.
    //
    //    - open the file
    //    - allocate memory for the pixels
    //    - describe the layout of the A, and Z pixel buffers
    //    - read the sample counts from the file
    //    - allocate the memory required to store the samples
    //    - read the pixels from the file
    //

    DeepTiledInputFile file (filename);

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    sampleCount.resizeErase (height, width);
    dataZ.resizeErase (height, width);
    dataA.resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    int numXTiles = file.numXTiles (0);
    int numYTiles = file.numYTiles (0);

    file.readPixelSampleCounts (0, numXTiles - 1, 0, numYTiles - 1);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            dataZ[i][j] = new float[sampleCount[i][j]];
            dataA[i][j] = new half[sampleCount[i][j]];
        }
    }

    file.readTiles (0, numXTiles - 1, 0, numYTiles - 1);

    // (after read data is processed, data must be freed:)

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}